

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O1

void av1_dist_wtd_convolve_2d_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  uint uVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int16_t *piVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [32];
  uint uVar36;
  int iVar37;
  ulong uVar38;
  char cVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint8_t *puVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined2 uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined2 uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  short sVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  int16_t im_block [1120];
  undefined1 (*local_a88) [16];
  undefined1 (*local_a78) [16];
  uint8_t *local_a70;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar46 [32];
  undefined1 auVar72 [32];
  
  iVar5 = conv_params->round_0;
  iVar6 = conv_params->round_1 + iVar5;
  cVar39 = (char)iVar6;
  uVar3 = filter_params_x->taps;
  auVar51._16_16_ =
       *(undefined1 (*) [16])(filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar3);
  auVar51._0_16_ =
       *(undefined1 (*) [16])(filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar3);
  piVar8 = filter_params_y->filter_ptr;
  uVar4 = filter_params_y->taps;
  uVar38 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar4);
  uVar2 = *(undefined4 *)(piVar8 + uVar38);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar58._16_4_ = uVar2;
  auVar58._0_16_ = auVar70;
  auVar58._20_4_ = uVar2;
  auVar58._24_4_ = uVar2;
  auVar58._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(piVar8 + uVar38 + 2);
  auVar45._4_4_ = uVar2;
  auVar45._0_4_ = uVar2;
  auVar45._8_4_ = uVar2;
  auVar45._12_4_ = uVar2;
  auVar46._16_4_ = uVar2;
  auVar46._0_16_ = auVar45;
  auVar46._20_4_ = uVar2;
  auVar46._24_4_ = uVar2;
  auVar46._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(piVar8 + uVar38 + 4);
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  auVar47._16_4_ = uVar2;
  auVar47._20_4_ = uVar2;
  auVar47._24_4_ = uVar2;
  auVar47._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(piVar8 + uVar38 + 6);
  auVar71._4_4_ = uVar2;
  auVar71._0_4_ = uVar2;
  auVar71._8_4_ = uVar2;
  auVar71._12_4_ = uVar2;
  auVar72._16_4_ = uVar2;
  auVar72._0_16_ = auVar71;
  auVar72._20_4_ = uVar2;
  auVar72._24_4_ = uVar2;
  auVar72._28_4_ = uVar2;
  uVar36 = 0xe - iVar6;
  uVar1 = iVar5 - 1;
  sVar63 = (short)((uint)(1 << ((byte)uVar1 & 0x1f)) >> 1) + 0x2000;
  uVar48 = (undefined2)conv_params->fwd_offset;
  auVar55._2_2_ = uVar48;
  auVar55._0_2_ = uVar48;
  auVar55._4_2_ = uVar48;
  auVar55._6_2_ = uVar48;
  auVar55._8_2_ = uVar48;
  auVar55._10_2_ = uVar48;
  auVar55._12_2_ = uVar48;
  auVar55._14_2_ = uVar48;
  auVar55._16_2_ = uVar48;
  auVar55._18_2_ = uVar48;
  auVar55._20_2_ = uVar48;
  auVar55._22_2_ = uVar48;
  auVar55._24_2_ = uVar48;
  auVar55._26_2_ = uVar48;
  auVar55._28_2_ = uVar48;
  auVar55._30_2_ = uVar48;
  auVar75 = ZEXT464(uVar1);
  local_a78 = (undefined1 (*) [16])conv_params->dst;
  iVar37 = (-1 << (0x15U - (char)iVar5 & 0x1f)) + ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1);
  lVar43 = (long)conv_params->dst_stride;
  uVar48 = (undefined2)conv_params->bck_offset;
  auVar56._2_2_ = uVar48;
  auVar56._0_2_ = uVar48;
  auVar56._4_2_ = uVar48;
  auVar56._6_2_ = uVar48;
  auVar56._8_2_ = uVar48;
  auVar56._10_2_ = uVar48;
  auVar56._12_2_ = uVar48;
  auVar56._14_2_ = uVar48;
  auVar56._16_2_ = uVar48;
  auVar56._18_2_ = uVar48;
  auVar56._20_2_ = uVar48;
  auVar56._22_2_ = uVar48;
  auVar56._24_2_ = uVar48;
  auVar56._26_2_ = uVar48;
  auVar56._28_2_ = uVar48;
  auVar56._30_2_ = uVar48;
  auVar13 = vpunpcklwd_avx2(auVar55,auVar56);
  iVar6 = conv_params->do_average;
  uVar7 = conv_params->round_1;
  iVar5 = conv_params->use_dist_wtd_comp_avg;
  uVar48 = (undefined2)((1 << (0x15U - cVar39 & 0x1f)) + (1 << (0x16U - cVar39 & 0x1f)));
  uVar59 = (undefined2)((uint)(1 << ((byte)uVar36 & 0x1f)) >> 1);
  auVar61._2_2_ = uVar59;
  auVar61._0_2_ = uVar59;
  auVar61._4_2_ = uVar59;
  auVar61._6_2_ = uVar59;
  auVar61._8_2_ = uVar59;
  auVar61._10_2_ = uVar59;
  auVar61._12_2_ = uVar59;
  auVar61._14_2_ = uVar59;
  auVar61._16_2_ = uVar59;
  auVar61._18_2_ = uVar59;
  auVar61._20_2_ = uVar59;
  auVar61._22_2_ = uVar59;
  auVar61._24_2_ = uVar59;
  auVar61._26_2_ = uVar59;
  auVar61._28_2_ = uVar59;
  auVar61._30_2_ = uVar59;
  auVar68._2_2_ = sVar63;
  auVar68._0_2_ = sVar63;
  auVar68._4_2_ = sVar63;
  auVar68._6_2_ = sVar63;
  auVar68._8_2_ = sVar63;
  auVar68._10_2_ = sVar63;
  auVar68._12_2_ = sVar63;
  auVar68._14_2_ = sVar63;
  auVar68._16_2_ = sVar63;
  auVar68._18_2_ = sVar63;
  auVar68._20_2_ = sVar63;
  auVar68._22_2_ = sVar63;
  auVar68._24_2_ = sVar63;
  auVar68._26_2_ = sVar63;
  auVar68._28_2_ = sVar63;
  auVar68._30_2_ = sVar63;
  auVar52 = vpsraw_avx2(auVar51,1);
  auVar51 = vpshufb_avx2(auVar52,_DAT_00569e20);
  auVar55 = vpshufb_avx2(auVar52,_DAT_00569e40);
  auVar56 = vpshufb_avx2(auVar52,_DAT_00569e60);
  auVar52 = vpshufb_avx2(auVar52,_DAT_00569e00);
  auVar69._4_4_ = iVar37;
  auVar69._0_4_ = iVar37;
  auVar69._8_4_ = iVar37;
  auVar69._12_4_ = iVar37;
  auVar69._16_4_ = iVar37;
  auVar69._20_4_ = iVar37;
  auVar69._24_4_ = iVar37;
  auVar69._28_4_ = iVar37;
  auVar9 = vpor_avx(auVar51._0_16_,auVar52._0_16_);
  auVar74 = ZEXT416(uVar1);
  auVar54 = ZEXT416(uVar7);
  local_a70 = dst0;
  if (auVar9._0_4_ == 0) {
    if (0 < w) {
      iVar37 = h + (uint)uVar4 + -1;
      auVar52._2_2_ = uVar48;
      auVar52._0_2_ = uVar48;
      auVar52._4_2_ = uVar48;
      auVar52._6_2_ = uVar48;
      auVar52._8_2_ = uVar48;
      auVar52._10_2_ = uVar48;
      auVar52._12_2_ = uVar48;
      auVar52._14_2_ = uVar48;
      auVar52._16_2_ = uVar48;
      auVar52._18_2_ = uVar48;
      auVar52._20_2_ = uVar48;
      auVar52._22_2_ = uVar48;
      auVar52._24_2_ = uVar48;
      auVar52._26_2_ = uVar48;
      auVar52._28_2_ = uVar48;
      auVar52._30_2_ = uVar48;
      auVar51 = vpsubw_avx2(auVar61,auVar52);
      lVar42 = (long)dst_stride0;
      uVar38 = 0;
      auVar62._16_16_ = _DAT_00515b60;
      auVar62._0_16_ = _DAT_00515b60;
      auVar60._16_16_ = _DAT_00515740;
      auVar60._0_16_ = _DAT_00515740;
      do {
        if (0 < iVar37) {
          pauVar34 = (undefined1 (*) [16])
                     (src + uVar38 + ~(long)(int)(((uVar4 >> 1) - 1) * src_stride));
          pauVar35 = (undefined1 (*) [32])local_920;
          lVar41 = 1;
          do {
            auVar53._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar34;
            auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            if (lVar41 < iVar37) {
              auVar53._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + src_stride) +
                   ZEXT116(1) * auVar53._0_16_;
              auVar53._16_16_ =
                   ZEXT116(0) * auVar53._16_16_ +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + src_stride);
            }
            pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride * 2);
            auVar52 = vpshufb_avx2(auVar53,auVar62);
            auVar61 = vpshufb_avx2(auVar53,auVar60);
            auVar52 = vpmaddubsw_avx2(auVar52,auVar55);
            auVar61 = vpmaddubsw_avx2(auVar61,auVar56);
            auVar52 = vpaddw_avx2(auVar68,auVar52);
            auVar52 = vpaddw_avx2(auVar52,auVar61);
            auVar52 = vpsraw_avx2(auVar52,auVar75._0_16_);
            *pauVar35 = auVar52;
            pauVar35 = pauVar35 + 1;
            lVar40 = lVar41 + 1;
            lVar41 = lVar41 + 2;
          } while (lVar40 < iVar37);
        }
        if (0 < h) {
          auVar10._16_16_ = auStack_8d0;
          auVar10._0_16_ = local_8e0;
          auVar33._16_16_ = local_8c0;
          auVar33._0_16_ = auStack_8d0;
          auVar62 = vpunpckhwd_avx2(auVar10,auVar33);
          auVar11._16_16_ = auStack_8f0;
          auVar11._0_16_ = local_900;
          auVar57._16_16_ = local_8e0;
          auVar57._0_16_ = auStack_8f0;
          auVar52 = vpunpckhwd_avx2(auVar11,auVar57);
          auVar12._16_16_ = auStack_910;
          auVar12._0_16_ = local_920;
          auVar14._16_16_ = local_900;
          auVar14._0_16_ = auStack_910;
          auVar61 = vpunpckhwd_avx2(auVar12,auVar14);
          auVar60 = vpunpcklwd_avx2(auVar10,auVar33);
          auVar11 = vpunpcklwd_avx2(auVar11,auVar57);
          auVar53 = vpunpcklwd_avx2(auVar12,auVar14);
          pauVar35 = (undefined1 (*) [32])auStack_8b0;
          lVar41 = 0;
          pauVar34 = local_a78;
          puVar44 = local_a70;
          do {
            auVar57 = auVar60;
            auVar10 = auVar52;
            auVar53 = vpmaddwd_avx2(auVar58,auVar53);
            auVar60 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
            auVar14 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
            auVar52 = vpmaddwd_avx2(auVar11,auVar46);
            auVar12 = vpmaddwd_avx2(auVar57,auVar47);
            auVar52 = vpaddd_avx2(auVar52,auVar12);
            auVar12 = vpmaddwd_avx2(auVar60,auVar72);
            auVar53 = vpaddd_avx2(auVar69,auVar53);
            auVar52 = vpaddd_avx2(auVar53,auVar52);
            auVar52 = vpaddd_avx2(auVar12,auVar52);
            auVar52 = vpsrad_avx2(auVar52,auVar54);
            if ((long)uVar38 < (long)((ulong)(uint)w - 4)) {
              auVar53 = vpmaddwd_avx2(auVar58,auVar61);
              auVar61 = vpmaddwd_avx2(auVar10,auVar46);
              auVar12 = vpmaddwd_avx2(auVar62,auVar47);
              auVar61 = vpaddd_avx2(auVar12,auVar61);
              auVar12 = vpmaddwd_avx2(auVar14,auVar72);
              auVar53 = vpaddd_avx2(auVar69,auVar53);
              auVar61 = vpaddd_avx2(auVar53,auVar61);
              auVar61 = vpaddd_avx2(auVar12,auVar61);
              auVar61 = vpsrad_avx2(auVar61,auVar54);
              auVar52 = vpackssdw_avx2(auVar52,auVar61);
              auVar18._2_2_ = uVar48;
              auVar18._0_2_ = uVar48;
              auVar18._4_2_ = uVar48;
              auVar18._6_2_ = uVar48;
              auVar18._8_2_ = uVar48;
              auVar18._10_2_ = uVar48;
              auVar18._12_2_ = uVar48;
              auVar18._14_2_ = uVar48;
              auVar18._16_2_ = uVar48;
              auVar18._18_2_ = uVar48;
              auVar18._20_2_ = uVar48;
              auVar18._22_2_ = uVar48;
              auVar18._24_2_ = uVar48;
              auVar18._26_2_ = uVar48;
              auVar18._28_2_ = uVar48;
              auVar18._30_2_ = uVar48;
              auVar52 = vpaddw_avx2(auVar52,auVar18);
              if (iVar6 == 0) {
LAB_0045f5ee:
                *pauVar34 = auVar52._0_16_;
                *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) = auVar52._16_16_;
              }
              else {
                auVar64._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                     ZEXT116(1) * *pauVar34;
                auVar64._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
                if (iVar5 == 0) {
                  auVar52 = vpaddw_avx2(auVar52,auVar64);
                  auVar52 = vpsraw_avx2(auVar52,1);
                }
                else {
                  auVar53 = vpunpcklwd_avx2(auVar64,auVar52);
                  auVar61 = vpunpckhwd_avx2(auVar64,auVar52);
                  auVar52 = vpmaddwd_avx2(auVar53,auVar13);
                  auVar61 = vpmaddwd_avx2(auVar61,auVar13);
                  auVar52 = vpsrad_avx2(auVar52,4);
                  auVar61 = vpsrad_avx2(auVar61,4);
                  auVar52 = vpackssdw_avx2(auVar52,auVar61);
                }
                auVar52 = vpaddw_avx2(auVar52,auVar51);
                auVar52 = vpsraw_avx2(auVar52,ZEXT416(uVar36));
                auVar52 = vpackuswb_avx2(auVar52,auVar46);
                *(long *)puVar44 = auVar52._0_8_;
                *(long *)(puVar44 + lVar42) = auVar52._16_8_;
              }
            }
            else {
              auVar52 = vpackssdw_avx2(auVar52,auVar52);
              auVar19._2_2_ = uVar48;
              auVar19._0_2_ = uVar48;
              auVar19._4_2_ = uVar48;
              auVar19._6_2_ = uVar48;
              auVar19._8_2_ = uVar48;
              auVar19._10_2_ = uVar48;
              auVar19._12_2_ = uVar48;
              auVar19._14_2_ = uVar48;
              auVar19._16_2_ = uVar48;
              auVar19._18_2_ = uVar48;
              auVar19._20_2_ = uVar48;
              auVar19._22_2_ = uVar48;
              auVar19._24_2_ = uVar48;
              auVar19._26_2_ = uVar48;
              auVar19._28_2_ = uVar48;
              auVar19._30_2_ = uVar48;
              auVar52 = vpaddw_avx2(auVar52,auVar19);
              if (iVar6 == 0) goto LAB_0045f5ee;
              auVar65._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                   ZEXT116(1) * *pauVar34;
              auVar65._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
              if (iVar5 == 0) {
                auVar52 = vpaddw_avx2(auVar52,auVar65);
                auVar52 = vpsraw_avx2(auVar52,1);
              }
              else {
                auVar53 = vpunpcklwd_avx2(auVar65,auVar52);
                auVar61 = vpunpckhwd_avx2(auVar65,auVar52);
                auVar52 = vpmaddwd_avx2(auVar53,auVar13);
                auVar61 = vpmaddwd_avx2(auVar61,auVar13);
                auVar52 = vpsrad_avx2(auVar52,4);
                auVar61 = vpsrad_avx2(auVar61,4);
                auVar52 = vpackssdw_avx2(auVar52,auVar61);
              }
              auVar52 = vpaddw_avx2(auVar52,auVar51);
              auVar52 = vpsraw_avx2(auVar52,ZEXT416(uVar36));
              auVar52 = vpackuswb_avx2(auVar52,auVar52);
              *(int *)puVar44 = auVar52._0_4_;
              *(int *)(puVar44 + lVar42) = auVar52._16_4_;
            }
            lVar41 = lVar41 + 2;
            pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar43 * 4);
            puVar44 = puVar44 + lVar42 * 2;
            pauVar35 = pauVar35 + 1;
            auVar53 = auVar11;
            auVar52 = auVar62;
            auVar62 = auVar14;
            auVar61 = auVar10;
            auVar11 = auVar57;
          } while (lVar41 < h);
        }
        uVar38 = uVar38 + 8;
        local_a78 = local_a78 + 1;
        local_a70 = local_a70 + 8;
        auVar75 = ZEXT1664(auVar74);
        auVar62._16_16_ = _DAT_00515b60;
        auVar62._0_16_ = _DAT_00515b60;
        auVar60._16_16_ = _DAT_00515740;
        auVar60._0_16_ = _DAT_00515740;
      } while (uVar38 < (uint)w);
    }
  }
  else {
    auVar9 = vpor_avx(auVar70,auVar71);
    if (auVar9._0_4_ == 0) {
      if (0 < w) {
        auVar20._2_2_ = uVar48;
        auVar20._0_2_ = uVar48;
        auVar20._4_2_ = uVar48;
        auVar20._6_2_ = uVar48;
        auVar20._8_2_ = uVar48;
        auVar20._10_2_ = uVar48;
        auVar20._12_2_ = uVar48;
        auVar20._14_2_ = uVar48;
        auVar20._16_2_ = uVar48;
        auVar20._18_2_ = uVar48;
        auVar20._20_2_ = uVar48;
        auVar20._22_2_ = uVar48;
        auVar20._24_2_ = uVar48;
        auVar20._26_2_ = uVar48;
        auVar20._28_2_ = uVar48;
        auVar20._30_2_ = uVar48;
        auVar61 = vpsubw_avx2(auVar61,auVar20);
        lVar42 = (long)dst_stride0;
        local_a88 = (undefined1 (*) [16])(src + (1 - (ulong)(uVar3 >> 1)));
        uVar38 = 0;
        auVar76._16_16_ = _DAT_00515740;
        auVar76._0_16_ = _DAT_00515740;
        auVar79._16_16_ = _DAT_00515750;
        auVar79._0_16_ = _DAT_00515750;
        auVar73._16_16_ = _DAT_00516590;
        auVar73._0_16_ = _DAT_00516590;
        do {
          if (-3 < h) {
            lVar41 = -2;
            pauVar35 = (undefined1 (*) [32])local_920;
            pauVar34 = local_a88;
            do {
              lVar41 = lVar41 + 2;
              auVar50._0_16_ =
                   ZEXT116(0) * auVar45 +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pauVar34 - (long)src_stride);
              auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45
              ;
              if (lVar41 < h + 2) {
                auVar50._0_16_ = ZEXT116(0) * *pauVar34 + ZEXT116(1) * auVar50._0_16_;
                auVar50._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * *pauVar34;
              }
              auVar58 = vpshufb_avx2(auVar50,_DAT_00516500);
              auVar62 = vpshufb_avx2(auVar50,auVar76);
              auVar60 = vpshufb_avx2(auVar50,auVar79);
              auVar53 = vpshufb_avx2(auVar50,auVar73);
              auVar72 = vpmaddubsw_avx2(auVar58,auVar51);
              auVar58 = vpmaddubsw_avx2(auVar62,auVar55);
              auVar62 = vpmaddubsw_avx2(auVar60,auVar56);
              auVar58 = vpaddw_avx2(auVar58,auVar62);
              auVar62 = vpmaddubsw_avx2(auVar53,auVar52);
              auVar72 = vpaddw_avx2(auVar68,auVar72);
              auVar58 = vpaddw_avx2(auVar72,auVar58);
              auVar58 = vpaddw_avx2(auVar58,auVar62);
              auVar58 = vpsraw_avx2(auVar58,auVar74);
              *pauVar35 = auVar58;
              pauVar35 = pauVar35 + 1;
              pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride * 2);
            } while (lVar41 <= h);
          }
          if (0 < h) {
            auVar28._16_16_ = auStack_8f0;
            auVar28._0_16_ = local_900;
            auVar30._16_16_ = local_8e0;
            auVar30._0_16_ = auStack_8f0;
            auVar72 = vpunpckhwd_avx2(auVar28,auVar30);
            auVar24._16_16_ = auStack_910;
            auVar24._0_16_ = local_920;
            auVar26._16_16_ = local_900;
            auVar26._0_16_ = auStack_910;
            auVar58 = vpunpckhwd_avx2(auVar24,auVar26);
            auVar62 = vpunpcklwd_avx2(auVar28,auVar30);
            auVar60 = vpunpcklwd_avx2(auVar24,auVar26);
            pauVar35 = (undefined1 (*) [32])auStack_8d0;
            lVar41 = 0;
            puVar44 = local_a70;
            pauVar34 = local_a78;
            do {
              auVar53 = auVar62;
              auVar62 = vpmaddwd_avx2(auVar60,auVar46);
              auVar60 = vpmaddwd_avx2(auVar53,auVar47);
              auVar62 = vpaddd_avx2(auVar69,auVar62);
              auVar62 = vpaddd_avx2(auVar62,auVar60);
              auVar62 = vpsrad_avx2(auVar62,auVar54);
              if ((long)uVar38 < (long)((ulong)(uint)w - 4)) {
                auVar58 = vpmaddwd_avx2(auVar58,auVar46);
                auVar60 = vpmaddwd_avx2(auVar72,auVar47);
                auVar58 = vpaddd_avx2(auVar69,auVar58);
                auVar58 = vpaddd_avx2(auVar58,auVar60);
                auVar58 = vpsrad_avx2(auVar58,auVar54);
                auVar58 = vpackssdw_avx2(auVar62,auVar58);
                auVar21._2_2_ = uVar48;
                auVar21._0_2_ = uVar48;
                auVar21._4_2_ = uVar48;
                auVar21._6_2_ = uVar48;
                auVar21._8_2_ = uVar48;
                auVar21._10_2_ = uVar48;
                auVar21._12_2_ = uVar48;
                auVar21._14_2_ = uVar48;
                auVar21._16_2_ = uVar48;
                auVar21._18_2_ = uVar48;
                auVar21._20_2_ = uVar48;
                auVar21._22_2_ = uVar48;
                auVar21._24_2_ = uVar48;
                auVar21._26_2_ = uVar48;
                auVar21._28_2_ = uVar48;
                auVar21._30_2_ = uVar48;
                auVar58 = vpaddw_avx2(auVar58,auVar21);
                if (iVar6 == 0) {
LAB_0045f90c:
                  *pauVar34 = auVar58._0_16_;
                  *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) = auVar58._16_16_;
                }
                else {
                  auVar66._0_16_ =
                       ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                       ZEXT116(1) * *pauVar34;
                  auVar66._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
                  if (iVar5 == 0) {
                    auVar58 = vpaddw_avx2(auVar58,auVar66);
                    auVar58 = vpsraw_avx2(auVar58,1);
                  }
                  else {
                    auVar60 = vpunpcklwd_avx2(auVar66,auVar58);
                    auVar62 = vpunpckhwd_avx2(auVar66,auVar58);
                    auVar58 = vpmaddwd_avx2(auVar60,auVar13);
                    auVar62 = vpmaddwd_avx2(auVar62,auVar13);
                    auVar58 = vpsrad_avx2(auVar58,4);
                    auVar62 = vpsrad_avx2(auVar62,4);
                    auVar58 = vpackssdw_avx2(auVar58,auVar62);
                  }
                  auVar58 = vpaddw_avx2(auVar61,auVar58);
                  auVar58 = vpsraw_avx2(auVar58,ZEXT416(uVar36));
                  auVar58 = vpackuswb_avx2(auVar58,auVar46);
                  *(long *)puVar44 = auVar58._0_8_;
                  *(long *)(puVar44 + lVar42) = auVar58._16_8_;
                }
              }
              else {
                auVar58 = vpackssdw_avx2(auVar62,auVar62);
                auVar22._2_2_ = uVar48;
                auVar22._0_2_ = uVar48;
                auVar22._4_2_ = uVar48;
                auVar22._6_2_ = uVar48;
                auVar22._8_2_ = uVar48;
                auVar22._10_2_ = uVar48;
                auVar22._12_2_ = uVar48;
                auVar22._14_2_ = uVar48;
                auVar22._16_2_ = uVar48;
                auVar22._18_2_ = uVar48;
                auVar22._20_2_ = uVar48;
                auVar22._22_2_ = uVar48;
                auVar22._24_2_ = uVar48;
                auVar22._26_2_ = uVar48;
                auVar22._28_2_ = uVar48;
                auVar22._30_2_ = uVar48;
                auVar58 = vpaddw_avx2(auVar58,auVar22);
                if (iVar6 == 0) goto LAB_0045f90c;
                auVar67._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                     ZEXT116(1) * *pauVar34;
                auVar67._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
                if (iVar5 == 0) {
                  auVar58 = vpaddw_avx2(auVar58,auVar67);
                  auVar58 = vpsraw_avx2(auVar58,1);
                }
                else {
                  auVar60 = vpunpcklwd_avx2(auVar67,auVar58);
                  auVar62 = vpunpckhwd_avx2(auVar67,auVar58);
                  auVar58 = vpmaddwd_avx2(auVar60,auVar13);
                  auVar62 = vpmaddwd_avx2(auVar62,auVar13);
                  auVar58 = vpsrad_avx2(auVar58,4);
                  auVar62 = vpsrad_avx2(auVar62,4);
                  auVar58 = vpackssdw_avx2(auVar58,auVar62);
                }
                auVar58 = vpaddw_avx2(auVar61,auVar58);
                auVar58 = vpsraw_avx2(auVar58,ZEXT416(uVar36));
                auVar58 = vpackuswb_avx2(auVar58,auVar58);
                *(int *)puVar44 = auVar58._0_4_;
                *(int *)(puVar44 + lVar42) = auVar58._16_4_;
              }
              auVar62 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
              auVar60 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
              lVar41 = lVar41 + 2;
              pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar43 * 4);
              puVar44 = puVar44 + lVar42 * 2;
              pauVar35 = pauVar35 + 1;
              auVar58 = auVar72;
              auVar72 = auVar60;
              auVar60 = auVar53;
            } while (lVar41 < h);
          }
          uVar38 = uVar38 + 8;
          local_a88 = (undefined1 (*) [16])(*local_a88 + 8);
          local_a78 = local_a78 + 1;
          local_a70 = local_a70 + 8;
        } while (uVar38 < (uint)w);
      }
    }
    else if (0 < w) {
      iVar37 = h + (uint)uVar4 + -1;
      auVar15._2_2_ = uVar48;
      auVar15._0_2_ = uVar48;
      auVar15._4_2_ = uVar48;
      auVar15._6_2_ = uVar48;
      auVar15._8_2_ = uVar48;
      auVar15._10_2_ = uVar48;
      auVar15._12_2_ = uVar48;
      auVar15._14_2_ = uVar48;
      auVar15._16_2_ = uVar48;
      auVar15._18_2_ = uVar48;
      auVar15._20_2_ = uVar48;
      auVar15._22_2_ = uVar48;
      auVar15._24_2_ = uVar48;
      auVar15._26_2_ = uVar48;
      auVar15._28_2_ = uVar48;
      auVar15._30_2_ = uVar48;
      auVar61 = vpsubw_avx2(auVar61,auVar15);
      lVar42 = (long)dst_stride0;
      uVar38 = 0;
      do {
        if (0 < iVar37) {
          pauVar34 = (undefined1 (*) [16])
                     (src + uVar38 + (-(ulong)(uVar3 >> 1) -
                                     (long)(int)(((uVar4 >> 1) - 1) * src_stride)) + 1);
          pauVar35 = (undefined1 (*) [32])local_920;
          lVar41 = 1;
          do {
            auVar49._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar34;
            auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            if (lVar41 < iVar37) {
              auVar49._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + src_stride) +
                   ZEXT116(1) * auVar49._0_16_;
              auVar49._16_16_ =
                   ZEXT116(0) * auVar49._16_16_ +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + src_stride);
            }
            pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride * 2);
            auVar62 = vpshufb_avx2(auVar49,_DAT_00516500);
            auVar53 = vpshufb_avx2(auVar49,_DAT_005164a0);
            auVar11 = vpshufb_avx2(auVar49,_DAT_005164c0);
            auVar12 = vpshufb_avx2(auVar49,_DAT_00516520);
            auVar60 = vpmaddubsw_avx2(auVar62,auVar51);
            auVar62 = vpmaddubsw_avx2(auVar53,auVar55);
            auVar53 = vpmaddubsw_avx2(auVar11,auVar56);
            auVar62 = vpaddw_avx2(auVar62,auVar53);
            auVar53 = vpmaddubsw_avx2(auVar12,auVar52);
            auVar60 = vpaddw_avx2(auVar68,auVar60);
            auVar62 = vpaddw_avx2(auVar60,auVar62);
            auVar62 = vpaddw_avx2(auVar62,auVar53);
            auVar62 = vpsraw_avx2(auVar62,auVar75._0_16_);
            *pauVar35 = auVar62;
            pauVar35 = pauVar35 + 1;
            lVar40 = lVar41 + 1;
            lVar41 = lVar41 + 2;
          } while (lVar40 < iVar37);
        }
        if (0 < h) {
          auVar31._16_16_ = auStack_8d0;
          auVar31._0_16_ = local_8e0;
          auVar32._16_16_ = local_8c0;
          auVar32._0_16_ = auStack_8d0;
          auVar62 = vpunpckhwd_avx2(auVar31,auVar32);
          auVar27._16_16_ = auStack_8f0;
          auVar27._0_16_ = local_900;
          auVar29._16_16_ = local_8e0;
          auVar29._0_16_ = auStack_8f0;
          auVar60 = vpunpckhwd_avx2(auVar27,auVar29);
          auVar23._16_16_ = auStack_910;
          auVar23._0_16_ = local_920;
          auVar25._16_16_ = local_900;
          auVar25._0_16_ = auStack_910;
          auVar53 = vpunpckhwd_avx2(auVar23,auVar25);
          auVar11 = vpunpcklwd_avx2(auVar31,auVar32);
          auVar14 = vpunpcklwd_avx2(auVar27,auVar29);
          auVar12 = vpunpcklwd_avx2(auVar23,auVar25);
          pauVar35 = (undefined1 (*) [32])auStack_8b0;
          lVar41 = 0;
          pauVar34 = local_a78;
          puVar44 = local_a70;
          do {
            auVar33 = auVar60;
            auVar19 = auVar11;
            auVar60 = auVar62;
            auVar11 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
            auVar62 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar35[-1] + 0x10),*pauVar35);
            auVar57 = vpmaddwd_avx2(auVar58,auVar12);
            auVar12 = vpmaddwd_avx2(auVar14,auVar46);
            auVar10 = vpmaddwd_avx2(auVar19,auVar47);
            auVar12 = vpaddd_avx2(auVar10,auVar12);
            auVar10 = vpmaddwd_avx2(auVar72,auVar11);
            auVar57 = vpaddd_avx2(auVar69,auVar57);
            auVar12 = vpaddd_avx2(auVar57,auVar12);
            auVar12 = vpaddd_avx2(auVar10,auVar12);
            auVar12 = vpsrad_avx2(auVar12,ZEXT416(uVar7));
            if ((long)uVar38 < (long)((ulong)(uint)w - 4)) {
              auVar57 = vpmaddwd_avx2(auVar53,auVar58);
              auVar53 = vpmaddwd_avx2(auVar33,auVar46);
              auVar10 = vpmaddwd_avx2(auVar60,auVar47);
              auVar53 = vpaddd_avx2(auVar53,auVar10);
              auVar10 = vpmaddwd_avx2(auVar72,auVar62);
              auVar57 = vpaddd_avx2(auVar69,auVar57);
              auVar53 = vpaddd_avx2(auVar53,auVar57);
              auVar53 = vpaddd_avx2(auVar10,auVar53);
              auVar53 = vpsrad_avx2(auVar53,ZEXT416(uVar7));
              auVar53 = vpackssdw_avx2(auVar12,auVar53);
              auVar16._2_2_ = uVar48;
              auVar16._0_2_ = uVar48;
              auVar16._4_2_ = uVar48;
              auVar16._6_2_ = uVar48;
              auVar16._8_2_ = uVar48;
              auVar16._10_2_ = uVar48;
              auVar16._12_2_ = uVar48;
              auVar16._14_2_ = uVar48;
              auVar16._16_2_ = uVar48;
              auVar16._18_2_ = uVar48;
              auVar16._20_2_ = uVar48;
              auVar16._22_2_ = uVar48;
              auVar16._24_2_ = uVar48;
              auVar16._26_2_ = uVar48;
              auVar16._28_2_ = uVar48;
              auVar16._30_2_ = uVar48;
              auVar53 = vpaddw_avx2(auVar53,auVar16);
              if (iVar6 == 0) {
LAB_0045f29d:
                *pauVar34 = auVar53._0_16_;
                *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) = auVar53._16_16_;
              }
              else {
                auVar77._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                     ZEXT116(1) * *pauVar34;
                auVar77._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
                if (iVar5 == 0) {
                  auVar53 = vpaddw_avx2(auVar77,auVar53);
                  auVar53 = vpsraw_avx2(auVar53,1);
                }
                else {
                  auVar57 = vpunpcklwd_avx2(auVar77,auVar53);
                  auVar12 = vpunpckhwd_avx2(auVar77,auVar53);
                  auVar53 = vpmaddwd_avx2(auVar13,auVar57);
                  auVar12 = vpmaddwd_avx2(auVar13,auVar12);
                  auVar57 = vpsrad_avx2(auVar53,4);
                  auVar53 = vpsrad_avx2(auVar12,4);
                  auVar53 = vpackssdw_avx2(auVar57,auVar53);
                }
                auVar53 = vpaddw_avx2(auVar53,auVar61);
                auVar53 = vpsraw_avx2(auVar53,ZEXT416(uVar36));
                auVar53 = vpackuswb_avx2(auVar53,auVar46);
                *(long *)puVar44 = auVar53._0_8_;
                *(long *)(puVar44 + lVar42) = auVar53._16_8_;
              }
            }
            else {
              auVar53 = vpackssdw_avx2(auVar12,auVar12);
              auVar17._2_2_ = uVar48;
              auVar17._0_2_ = uVar48;
              auVar17._4_2_ = uVar48;
              auVar17._6_2_ = uVar48;
              auVar17._8_2_ = uVar48;
              auVar17._10_2_ = uVar48;
              auVar17._12_2_ = uVar48;
              auVar17._14_2_ = uVar48;
              auVar17._16_2_ = uVar48;
              auVar17._18_2_ = uVar48;
              auVar17._20_2_ = uVar48;
              auVar17._22_2_ = uVar48;
              auVar17._24_2_ = uVar48;
              auVar17._26_2_ = uVar48;
              auVar17._28_2_ = uVar48;
              auVar17._30_2_ = uVar48;
              auVar53 = vpaddw_avx2(auVar53,auVar17);
              if (iVar6 == 0) goto LAB_0045f29d;
              auVar78._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2) +
                   ZEXT116(1) * *pauVar34;
              auVar78._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar34 + lVar43 * 2);
              if (iVar5 == 0) {
                auVar53 = vpaddw_avx2(auVar78,auVar53);
                auVar53 = vpsraw_avx2(auVar53,1);
              }
              else {
                auVar57 = vpunpcklwd_avx2(auVar78,auVar53);
                auVar12 = vpunpckhwd_avx2(auVar78,auVar53);
                auVar53 = vpmaddwd_avx2(auVar13,auVar57);
                auVar12 = vpmaddwd_avx2(auVar13,auVar12);
                auVar57 = vpsrad_avx2(auVar53,4);
                auVar53 = vpsrad_avx2(auVar12,4);
                auVar53 = vpackssdw_avx2(auVar57,auVar53);
              }
              auVar53 = vpaddw_avx2(auVar53,auVar61);
              auVar53 = vpsraw_avx2(auVar53,ZEXT416(uVar36));
              auVar53 = vpackuswb_avx2(auVar53,auVar53);
              *(int *)puVar44 = auVar53._0_4_;
              *(int *)(puVar44 + lVar42) = auVar53._16_4_;
            }
            lVar41 = lVar41 + 2;
            pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar43 * 4);
            puVar44 = puVar44 + lVar42 * 2;
            pauVar35 = pauVar35 + 1;
            auVar12 = auVar14;
            auVar53 = auVar33;
            auVar14 = auVar19;
          } while (lVar41 < h);
        }
        uVar38 = uVar38 + 8;
        local_a78 = local_a78 + 1;
        local_a70 = local_a70 + 8;
        auVar75 = ZEXT1664(auVar74);
      } while (uVar38 < (uint)w);
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_avx2(const uint8_t *src, int src_stride,
                                   uint8_t *dst0, int dst_stride0, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_x_qn, const int subpel_y_qn,
                                   ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);

  int im_stride = 8;
  int i, is_horiz_4tap = 0, is_vert_4tap = 0;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(conv_params->round_0 > 0);

  const __m256i round_const_h = _mm256_set1_epi16(
      ((1 << (conv_params->round_0 - 1)) >> 1) + (1 << (bd + FILTER_BITS - 2)));
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  const __m256i round_const_v = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  __m256i filt[4], coeffs_x[4], coeffs_y[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_x[0], coeffs_x[3]), 0)))
    is_horiz_4tap = 1;

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_y[0], coeffs_y[3]), 0)))
    is_vert_4tap = 1;

  if (is_horiz_4tap) {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;
    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      for (i = 0; i < im_h; i += 2) {
        __m256i data =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)src_h));
        if (i + 1 < im_h)
          data = _mm256_inserti128_si256(
              data, _mm_loadu_si128((__m128i *)(src_h + src_stride)), 1);
        src_h += (src_stride << 1);
        __m256i res = convolve_lowbd_x_4tap(data, coeffs_x + 1, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h),
                               round_shift_h);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  } else if (is_vert_4tap) {
    int im_h = h + 3;
    const int fo_vert = 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      /* Vertical filter */
      __m256i s[6];
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);

      s[3] = _mm256_unpackhi_epi16(s0, s1);
      s[4] = _mm256_unpackhi_epi16(s2, s3);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s4 =
            _mm256_loadu_si256((__m256i *)(data + 4 * im_stride));
        const __m256i s5 =
            _mm256_loadu_si256((__m256i *)(data + 5 * im_stride));

        s[2] = _mm256_unpacklo_epi16(s4, s5);
        s[5] = _mm256_unpackhi_epi16(s4, s5);

        const __m256i res_a = convolve_4tap(s, coeffs_y + 1);
        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);

        if (w - j > 4) {
          const __m256i res_b = convolve_4tap(s + 3, coeffs_y + 1);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_v), round_shift_v);
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_b_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_a_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);

          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  }
}